

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic.c++
# Opt level: O0

void __thiscall
capnp::Orphan<capnp::DynamicValue>::Orphan
          (Orphan<capnp::DynamicValue> *this,Builder *value,OrphanBuilder *builder)

{
  Type TVar1;
  OrphanBuilder *other;
  StructSchema SVar2;
  InterfaceSchema IVar3;
  Type TVar4;
  OrphanBuilder *builder_local;
  Builder *value_local;
  Orphan<capnp::DynamicValue> *this_local;
  
  TVar1 = DynamicValue::Builder::getType(value);
  this->type = TVar1;
  other = kj::mv<capnp::_::OrphanBuilder>(builder);
  capnp::_::OrphanBuilder::OrphanBuilder(&this->builder,other);
  switch(this->type) {
  case UNKNOWN:
    break;
  case VOID:
    break;
  case BOOL:
    (this->field_1).boolValue = (bool)((value->field_1).boolValue & 1);
    break;
  case INT:
    (this->field_1).intValue = (value->field_1).intValue;
    break;
  case UINT:
    (this->field_1).intValue = (value->field_1).intValue;
    break;
  case FLOAT:
    (this->field_1).intValue = (value->field_1).intValue;
    break;
  case TEXT:
    break;
  case DATA:
    break;
  case LIST:
    TVar4 = (Type)DynamicList::Builder::getSchema(&(value->field_1).listValue);
    (this->field_1).listSchema.elementType = TVar4;
    break;
  case ENUM:
    (this->field_1).intValue = (value->field_1).intValue;
    (this->field_1).enumValue.value =
         *(uint16_t *)&(value->field_1).listValue.schema.elementType.field_4;
    break;
  case STRUCT:
    SVar2 = DynamicStruct::Builder::getSchema(&(value->field_1).structValue);
    (this->field_1).structSchema.super_Schema.raw = (RawBrandedSchema *)SVar2.super_Schema.raw;
    break;
  case CAPABILITY:
    IVar3 = DynamicCapability::Client::getSchema(&(value->field_1).capabilityValue);
    (this->field_1).interfaceSchema.super_Schema.raw = (RawBrandedSchema *)IVar3.super_Schema.raw;
    break;
  case ANY_POINTER:
  }
  return;
}

Assistant:

Orphan<DynamicValue>::Orphan(DynamicValue::Builder value, _::OrphanBuilder&& builder)
    : type(value.getType()), builder(kj::mv(builder)) {
  switch (type) {
    case DynamicValue::UNKNOWN: break;
    case DynamicValue::VOID: voidValue = value.voidValue; break;
    case DynamicValue::BOOL: boolValue = value.boolValue; break;
    case DynamicValue::INT: intValue = value.intValue; break;
    case DynamicValue::UINT: uintValue = value.uintValue; break;
    case DynamicValue::FLOAT: floatValue = value.floatValue; break;
    case DynamicValue::ENUM: enumValue = value.enumValue; break;

    case DynamicValue::TEXT: break;
    case DynamicValue::DATA: break;
    case DynamicValue::LIST: listSchema = value.listValue.getSchema(); break;
    case DynamicValue::STRUCT: structSchema = value.structValue.getSchema(); break;
    case DynamicValue::CAPABILITY: interfaceSchema = value.capabilityValue.getSchema(); break;
    case DynamicValue::ANY_POINTER: break;
  }
}